

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventAgent.h
# Opt level: O1

ssize_t __thiscall
SyncRetEventAgent<int>::send
          (SyncRetEventAgent<int> *this,int __fd,void *__buf,size_t __n,int __flags)

{
  uint uVar1;
  char cVar2;
  undefined4 in_register_00000034;
  long *plVar3;
  SmartPtr<EventAgent> holdMe;
  SmartPtr<EventAgent> local_20;
  
  plVar3 = (long *)CONCAT44(in_register_00000034,__fd);
  local_20.mObj = (EventAgent *)this;
  pthread_mutex_lock((pthread_mutex_t *)&Mutex::mCriticalSection);
  *(int *)&this->field_0x8 = *(int *)&this->field_0x8 + 1;
  pthread_mutex_unlock((pthread_mutex_t *)&Mutex::mCriticalSection);
  cVar2 = (**(code **)(*plVar3 + 0x38))(plVar3);
  if (cVar2 == '\0') {
    (**(code **)*plVar3)(plVar3,this);
  }
  else {
    (**(code **)(*(long *)this + 0x18))(this);
  }
  uVar1 = this->mRetValue;
  SmartPtr<EventAgent>::~SmartPtr(&local_20);
  return (ulong)uVar1;
}

Assistant:

ReturnType send(IEventDispatcher *dispatcher)
	{
		// The SyncRetEventAgent needs to make sure that after it
		// is dispatched and delivered the agent remains valid until
		// we are ready to return the value we filled in in the deliver
		// method.   In this case though we are going to use the
		// SmartPtr<> template and C++ scoping to do the AddRef and
		// Release so that we can return mRetValue directly without
		// making an explicit copy on the stack.
		
		// This is necessary because as soon as the dispatcher->sendEventSync
		// returns the only gauranteed reference to "this" object is the
		// one that is taken in this method.   Once we release that reference
		// "this" is possibly invalid and should not be accessed by again
		// before the method returns.
		
		SmartPtr<EventAgent> holdMe = this;
		
		if (dispatcher->isThreadCurrent())
		{
			deliver();
		}
		else
		{
			dispatcher->sendEventSync(this);
		}
		
		// Return the filled in return value.   This will make
		// an appropriate copy of mRetValue before the SmartPtr<>
		// falls out of scope and releases this object.
		return mRetValue;
	}